

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O0

void __thiscall
CreditCard::CreditCard(CreditCard *this,double amount,long _number,string *_type,string *_expDate)

{
  string *_expDate_local;
  string *_type_local;
  long _number_local;
  double amount_local;
  CreditCard *this_local;
  
  Payment::Payment(&this->super_Payment,amount);
  (this->super_Payment)._vptr_Payment = (_func_int **)&PTR__CreditCard_0011ac00;
  std::__cxx11::string::string((string *)&this->type);
  std::__cxx11::string::string((string *)&this->expDate);
  this->number = _number;
  std::__cxx11::string::operator=((string *)&this->type,(string *)_type);
  std::__cxx11::string::operator=((string *)&this->expDate,(string *)_expDate);
  return;
}

Assistant:

CreditCard::CreditCard(double amount,long _number,string _type,string _expDate):Payment(amount){
	 number=_number;
	 type=_type;
	 expDate=_expDate;
}